

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O0

int inflatePrime(z_streamp strm,int bits,int value)

{
  internal_state *piVar1;
  inflate_state *state;
  int value_local;
  int bits_local;
  z_streamp strm_local;
  
  if ((strm == (z_streamp)0x0) || (strm->state == (internal_state *)0x0)) {
    strm_local._4_4_ = -2;
  }
  else {
    piVar1 = strm->state;
    if (bits < 0) {
      *(undefined8 *)(piVar1 + 0x48) = 0;
      *(undefined4 *)(piVar1 + 0x50) = 0;
      strm_local._4_4_ = 0;
    }
    else if ((bits < 0x11) && ((uint)(*(int *)(piVar1 + 0x50) + bits) < 0x21)) {
      *(long *)(piVar1 + 0x48) =
           (long)(int)((value & (int)(1L << ((byte)bits & 0x3f)) - 1U) <<
                      ((byte)*(undefined4 *)(piVar1 + 0x50) & 0x1f)) + *(long *)(piVar1 + 0x48);
      *(int *)(piVar1 + 0x50) = bits + *(int *)(piVar1 + 0x50);
      strm_local._4_4_ = 0;
    }
    else {
      strm_local._4_4_ = -2;
    }
  }
  return strm_local._4_4_;
}

Assistant:

int ZEXPORT inflatePrime(strm, bits, value)
z_streamp strm;
int bits;
int value;
{
    struct inflate_state FAR *state;

    if (strm == Z_NULL || strm->state == Z_NULL) return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)strm->state;
    if (bits < 0) {
        state->hold = 0;
        state->bits = 0;
        return Z_OK;
    }
    if (bits > 16 || state->bits + bits > 32) return Z_STREAM_ERROR;
    value &= (1L << bits) - 1;
    state->hold += value << state->bits;
    state->bits += bits;
    return Z_OK;
}